

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O2

int mbedtls_mpi_add_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  ulong uVar1;
  mbedtls_mpi_uint *X_00;
  int iVar2;
  ulong nblimbs;
  mbedtls_mpi_uint mVar3;
  long lVar4;
  ulong *puVar5;
  long lVar6;
  bool bVar7;
  
  bVar7 = X == B;
  if (bVar7) {
    B = A;
  }
  if ((A == X || bVar7) || (iVar2 = mbedtls_mpi_copy(X,A), iVar2 == 0)) {
    X->s = 1;
    lVar6 = (ulong)B->n * -8;
    iVar2 = 0;
    nblimbs = (ulong)B->n;
    while (nblimbs != 0) {
      if (B->p[nblimbs - 1] != 0) {
        iVar2 = mbedtls_mpi_grow(X,nblimbs);
        if (iVar2 != 0) {
          return iVar2;
        }
        lVar4 = -lVar6;
        X_00 = X->p;
        mVar3 = mbedtls_mpi_core_add(X_00,X_00,B->p,nblimbs);
        puVar5 = (ulong *)((long)X_00 - lVar6);
        do {
          if (mVar3 == 0) {
            return 0;
          }
          if (X->n <= nblimbs) {
            iVar2 = mbedtls_mpi_grow(X,nblimbs + 1);
            if (iVar2 != 0) {
              return iVar2;
            }
            puVar5 = (ulong *)((long)X->p + lVar4);
          }
          uVar1 = *puVar5;
          *puVar5 = *puVar5 + mVar3;
          mVar3 = (mbedtls_mpi_uint)CARRY8(uVar1,mVar3);
          puVar5 = puVar5 + 1;
          lVar4 = lVar4 + 8;
          nblimbs = nblimbs + 1;
        } while( true );
      }
      lVar6 = lVar6 + 8;
      nblimbs = nblimbs - 1;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_add_abs(mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t j;
    mbedtls_mpi_uint *p;
    mbedtls_mpi_uint c;

    if (X == B) {
        const mbedtls_mpi *T = A; A = X; B = T;
    }

    if (X != A) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(X, A));
    }

    /*
     * X must always be positive as a result of unsigned additions.
     */
    X->s = 1;

    for (j = B->n; j > 0; j--) {
        if (B->p[j - 1] != 0) {
            break;
        }
    }

    /* Exit early to avoid undefined behavior on NULL+0 when X->n == 0
     * and B is 0 (of any size). */
    if (j == 0) {
        return 0;
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, j));

    /* j is the number of non-zero limbs of B. Add those to X. */

    p = X->p;

    c = mbedtls_mpi_core_add(p, p, B->p, j);

    p += j;

    /* Now propagate any carry */

    while (c != 0) {
        if (j >= X->n) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, j + 1));
            p = X->p + j;
        }

        *p += c; c = (*p < c); j++; p++;
    }

cleanup:

    return ret;
}